

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O3

void deferred_ping(void *arg,void *arg2)

{
  char *pcVar1;
  char cVar2;
  long lVar3;
  fio_defer_task_s task;
  fio_data_s *pfVar4;
  int *piVar5;
  int iVar6;
  ulong uVar7;
  undefined1 *puVar8;
  long lVar9;
  fio_lock_i ret;
  
  pfVar4 = fio_data;
  lVar9 = (long)(int)((ulong)arg >> 8) * 0xa8;
  if (*(long *)((long)fio_data + lVar9 + 0x58) != 0) {
    uVar7 = (ulong)*(byte *)((long)fio_data + lVar9 + 0x6a);
    if ((uVar7 == 0) ||
       ((long)(uVar7 + *(long *)((long)fio_data + lVar9 + 0x60)) <= (fio_data->last_cycle).tv_sec))
    {
      piVar5 = __errno_location();
      *piVar5 = 0;
      LOCK();
      pcVar1 = (char *)((long)pfVar4 + lVar9 + 0x6c);
      cVar2 = *pcVar1;
      *pcVar1 = '\x01';
      UNLOCK();
      iVar6 = 0xb;
      if (cVar2 == '\0') {
        lVar3 = *(long *)((long)fio_data + lVar9 + 0x58);
        if (lVar3 == 0) {
          LOCK();
          *(undefined1 *)((long)fio_data + lVar9 + 0x6c) = 0;
          UNLOCK();
          iVar6 = 9;
        }
        else {
          LOCK();
          cVar2 = *(char *)(lVar3 + 0x29);
          *(char *)(lVar3 + 0x29) = '\x01';
          UNLOCK();
          puVar8 = (undefined1 *)((long)fio_data + lVar9 + 0x6c);
          if (cVar2 == '\0') {
            LOCK();
            *puVar8 = 0;
            UNLOCK();
            (**(code **)(lVar3 + 0x20))(arg,lVar3);
            LOCK();
            *(undefined1 *)(lVar3 + 0x29) = 0;
            UNLOCK();
            return;
          }
          LOCK();
          *puVar8 = 0;
          UNLOCK();
        }
      }
      *piVar5 = iVar6;
      task.arg1 = arg;
      task.func = deferred_ping;
      task.arg2 = (void *)0x0;
      fio_defer_push_task_fn(task,&task_queue_normal);
    }
  }
  return;
}

Assistant:

static void deferred_ping(void *arg, void *arg2) {
  if (!uuid_data(arg).protocol ||
      (uuid_data(arg).timeout &&
       (uuid_data(arg).timeout + uuid_data(arg).active >
        (fio_data->last_cycle.tv_sec)))) {
    return;
  }
  fio_protocol_s *pr = protocol_try_lock(fio_uuid2fd(arg), FIO_PR_LOCK_WRITE);
  if (!pr)
    goto postpone;
  pr->ping((intptr_t)arg, pr);
  protocol_unlock(pr, FIO_PR_LOCK_WRITE);
  return;
postpone:
  fio_defer_push_task(deferred_ping, arg, NULL);
  (void)arg2;
}